

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall
presolve::HPresolve::fixColToLowerOrUnbounded
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  HPresolve *pHVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  int in_EDX;
  double in_RSI;
  HPresolve *in_RDI;
  HighsPostsolveStack *unaff_retaddr;
  HighsInt colpos;
  double colval;
  HighsInt colrow;
  HighsInt coliter;
  bool logging_on;
  double fixval;
  HighsInt in_stack_ffffffffffffff4c;
  HPresolve *in_stack_ffffffffffffff50;
  double dVar7;
  HPresolve *this_00;
  HighsInt in_stack_ffffffffffffffac;
  uint uVar8;
  uint row;
  HPresolve *in_stack_ffffffffffffffb0;
  HighsInt in_stack_ffffffffffffffbc;
  HPresolveAnalysis *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar9;
  HPresolve *fixValue;
  HighsInt in_stack_fffffffffffffffc;
  
  fixValue = in_RDI;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_lower_,(long)in_EDX);
  pHVar1 = (HPresolve *)*pvVar4;
  if (((double)pHVar1 != -INFINITY) || (NAN((double)pHVar1))) {
    bVar3 = (bool)((in_RDI->analysis_).logging_on_ & 1);
    if (bVar3 != false) {
      HPresolveAnalysis::startPresolveRuleLog
                ((HPresolveAnalysis *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    this_00 = pHVar1;
    iVar9 = in_EDX;
    std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->model->col_cost_,(long)in_EDX)
    ;
    getColumnVector(this_00,in_EDX);
    HighsPostsolveStack::fixedColAtLower<HighsTripletListSlice>
              (unaff_retaddr,in_stack_fffffffffffffffc,(double)fixValue,in_RSI,
               (HighsMatrixSlice<HighsTripletListSlice> *)CONCAT44(iVar9,in_stack_ffffffffffffffe0))
    ;
    markColDeleted(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->colhead,(long)iVar9);
    uVar8 = *puVar5;
    while (uVar8 != 0xffffffff) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Arow,(long)(int)uVar8);
      iVar2 = *pvVar6;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Avalue,(long)(int)uVar8);
      dVar7 = *pvVar4;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&in_RDI->Anext,(long)(int)uVar8);
      row = *puVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)iVar2);
      if ((*pvVar4 != -INFINITY) || (NAN(*pvVar4))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->row_lower_,(long)iVar2);
        *pvVar4 = -dVar7 * (double)pHVar1 + *pvVar4;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)iVar2);
      if ((*pvVar4 != INFINITY) || (NAN(*pvVar4))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->row_upper_,(long)iVar2);
        *pvVar4 = -dVar7 * (double)pHVar1 + *pvVar4;
      }
      unlink(in_RDI,(char *)(ulong)uVar8);
      reinsertEquation(in_stack_ffffffffffffffb0,row);
      uVar8 = row;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)iVar9);
    in_RDI->model->offset_ = *pvVar4 * (double)pHVar1 + in_RDI->model->offset_;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)iVar9);
    *pvVar4 = 0.0;
    (in_RDI->analysis_).logging_on_ = bVar3;
    if (bVar3 != false) {
      HPresolveAnalysis::stopPresolveRuleLog(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool HPresolve::fixColToLowerOrUnbounded(HighsPostsolveStack& postsolve_stack,
                                         HighsInt col) {
  double fixval = model->col_lower_[col];
  if (fixval == -kHighsInf) return true;

  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleFixedCol);

  // printf("fixing column %" HIGHSINT_FORMAT " to %.15g\n", col, fixval);

  // mark the column as deleted first so that it is not registered as singleton
  // column upon removing its nonzeros
  postsolve_stack.fixedColAtLower(col, fixval, model->col_cost_[col],
                                  getColumnVector(col));
  markColDeleted(col);

  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];
    assert(Acol[coliter] == col);

    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] -= colval * fixval;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] -= colval * fixval;

    unlink(colpos);

    reinsertEquation(colrow);
  }

  model->offset_ += model->col_cost_[col] * fixval;
  assert(std::isfinite(model->offset_));
  model->col_cost_[col] = 0;
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleFixedCol);
  return false;
}